

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O3

int64_t CScriptNum::set_vch(vector<unsigned_char,_std::allocator<unsigned_char>_> *vch)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  puVar1 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    uVar3 = 0;
  }
  else {
    bVar4 = 0;
    lVar5 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 | (ulong)puVar1[lVar5] << (bVar4 & 0x3f);
      lVar5 = lVar5 + 1;
      bVar4 = bVar4 + 8;
    } while ((long)puVar2 - (long)puVar1 != lVar5);
    if ((char)puVar2[-1] < '\0') {
      uVar3 = -(uVar3 & ~(0x80L << ((char)((int)((long)puVar2 - (long)puVar1) << 3) - 8U & 0x3f)));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int64_t set_vch(const std::vector<unsigned char>& vch)
    {
      if (vch.empty())
          return 0;

      int64_t result = 0;
      for (size_t i = 0; i != vch.size(); ++i)
          result |= static_cast<int64_t>(vch[i]) << 8*i;

      // If the input vector's most significant byte is 0x80, remove it from
      // the result's msb and return a negative.
      if (vch.back() & 0x80)
          return -((int64_t)(result & ~(0x80ULL << (8 * (vch.size() - 1)))));

      return result;
    }